

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser_exception.cpp
# Opt level: O0

char * __thiscall argo::json_parser_exception::get_main_message(json_parser_exception *this)

{
  json_parser_exception *this_local;
  
  switch((this->super_json_exception).m_type) {
  case invalid_character_e:
    this_local = (json_parser_exception *)anon_var_dwarf_1dcfc;
    break;
  case invalid_number_e:
    this_local = (json_parser_exception *)anon_var_dwarf_1dd1f;
    break;
  case number_out_of_range_e:
    this_local = (json_parser_exception *)anon_var_dwarf_1dd35;
    break;
  case number_too_long_e:
    this_local = (json_parser_exception *)anon_var_dwarf_1dd4b;
    break;
  case string_too_long_e:
    this_local = (json_parser_exception *)anon_var_dwarf_1dd61;
    break;
  case unexpected_eof_e:
    this_local = (json_parser_exception *)anon_var_dwarf_1dd6b;
    break;
  case unexpected_token_e:
    this_local = (json_parser_exception *)anon_var_dwarf_1dd81;
    break;
  default:
    this_local = (json_parser_exception *)anon_var_dwarf_eb20;
  }
  return (char *)this_local;
}

Assistant:

const char *json_parser_exception::get_main_message()
{
    switch (m_type)
    {
    case invalid_character_e:
        return "invalid character";
    case invalid_number_e:
        return "invalid number format";
    case number_out_of_range_e:
        return "number out of range";
    case number_too_long_e:
        return "number too long";
    case string_too_long_e:
        return "string too long";
    case unexpected_eof_e:
        return "unexpected end of file";
    case unexpected_token_e:
        return "unexpected token";
    default:
        return "generic";
    }

}